

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall
QPDFJob::doProcessOnce
          (QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,
          function<void_(QPDF_*,_const_char_*)> *fn,char *password,bool empty,bool used_for_input,
          bool main_input)

{
  QPDF *this_00;
  element_type *peVar1;
  undefined1 auVar2 [12];
  _Alloc_hider __p;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  allocator<char> local_55;
  undefined4 local_54;
  string local_50;
  
  local_54 = CONCAT31(in_register_00000089,used_for_input);
  std::make_unique<QPDF>();
  __p._M_p = local_50._M_dataplus._M_p;
  auVar2._4_8_ = 0;
  auVar2._0_4_ = (uint)local_50._M_string_length;
  local_50._0_12_ = auVar2 << 0x40;
  std::__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>::reset
            ((__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_> *)pdf,(pointer)__p._M_p);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_50);
  setQPDFOptions(this,(pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                      super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                      super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
  if (CONCAT31(in_register_00000081,empty) == 0) {
    if ((main_input) &&
       (peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar1->json_input == true)) {
      this_00 = (pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 (peVar1->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_55);
      QPDF::createFromJSON(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      std::function<void_(QPDF_*,_const_char_*)>::operator()
                (fn,(pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                    super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,password);
    }
  }
  else {
    QPDF::emptyPDF((pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                   super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
  }
  if ((char)local_54 != '\0') {
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50._0_12_ =
         QPDF::getVersionAsPDFVersion
                   ((pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                    super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
    PDFVersion::updateIfGreater(&peVar1->max_input_version,(PDFVersion *)&local_50);
  }
  return;
}

Assistant:

void
QPDFJob::doProcessOnce(
    std::unique_ptr<QPDF>& pdf,
    std::function<void(QPDF*, char const*)> fn,
    char const* password,
    bool empty,
    bool used_for_input,
    bool main_input)
{
    pdf = std::make_unique<QPDF>();
    setQPDFOptions(*pdf);
    if (empty) {
        pdf->emptyPDF();
    } else if (main_input && m->json_input) {
        pdf->createFromJSON(m->infilename.get());
    } else {
        fn(pdf.get(), password);
    }
    if (used_for_input) {
        m->max_input_version.updateIfGreater(pdf->getVersionAsPDFVersion());
    }
}